

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O0

unique_ptr<grpc_generator::Printer,_std::default_delete<grpc_generator::Printer>_> __thiscall
flatbuffers::FlatBufFile::CreatePrinter(FlatBufFile *this,string *str,char indentation_type)

{
  FlatBufPrinter *this_00;
  char in_CL;
  undefined7 in_register_00000011;
  char indentation_type_local;
  string *str_local;
  FlatBufFile *this_local;
  
  this_00 = (FlatBufPrinter *)operator_new(0x30);
  FlatBufPrinter::FlatBufPrinter
            (this_00,(string *)CONCAT71(in_register_00000011,indentation_type),in_CL);
  std::unique_ptr<grpc_generator::Printer,std::default_delete<grpc_generator::Printer>>::
  unique_ptr<std::default_delete<grpc_generator::Printer>,void>
            ((unique_ptr<grpc_generator::Printer,std::default_delete<grpc_generator::Printer>> *)
             this,(pointer)this_00);
  return (__uniq_ptr_data<grpc_generator::Printer,_std::default_delete<grpc_generator::Printer>,_true,_true>
          )(__uniq_ptr_data<grpc_generator::Printer,_std::default_delete<grpc_generator::Printer>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<grpc_generator::Printer> CreatePrinter(
      std::string *str, const char indentation_type = ' ') const {
    return std::unique_ptr<grpc_generator::Printer>(
        new FlatBufPrinter(str, indentation_type));
  }